

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall czh::node::Node::Node(Node *this,Node *node)

{
  variant_alternative_t<0UL,_variant<NodeData,_Value>_> *pvVar1;
  _List_node_base *p_Var2;
  
  std::__cxx11::string::string((string *)this,&node->name);
  this->last_node = node->last_node;
  std::__detail::__variant::_Copy_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value>::
  _Copy_ctor_base((_Copy_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value> *)
                  &this->data,
                  (_Copy_ctor_base<false,_czh::node::Node::NodeData,_czh::value::Value> *)
                  &node->data);
  token::Token::Token(&this->czh_token,&node->czh_token);
  if (*(__index_type *)
       ((long)&(this->data).super__Variant_base<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_assign_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Move_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Copy_ctor_alias<czh::node::Node::NodeData,_czh::value::Value>.
               super__Variant_storage_alias<czh::node::Node::NodeData,_czh::value::Value> + 0x48) ==
      '\0') {
    pvVar1 = std::get<0ul,czh::node::Node::NodeData,czh::value::Value>(&this->data);
    p_Var2 = (_List_node_base *)&pvVar1->nodes;
    while (p_Var2 = (((_List_base<czh::node::Node,_std::allocator<czh::node::Node>_> *)
                     &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&pvVar1->nodes) {
      p_Var2[3]._M_next = (_List_node_base *)this;
    }
  }
  return;
}

Assistant:

explicit Node(const Node &node) : name(node.name), last_node(node.last_node), czh_token(node.czh_token),
                                      data(node.data)
    {
      if (is_node())
      {
        auto &nd = std::get<NodeData>(data);
        for (auto &r: nd.nodes)
        {
          r.last_node = this;
        }
      }
    }